

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O2

void __thiscall duckdb::CSVGlobalState::FillRejectsTable(CSVGlobalState *this,CSVFileScan *scan)

{
  pointer limit;
  pointer pTVar1;
  CSVRejectsTable *pCVar2;
  CSVRejectsTable *pCVar3;
  TableCatalogEntry *table_p;
  TableCatalogEntry *table_p_00;
  idx_t scan_idx;
  idx_t iVar4;
  reference pvVar5;
  CSVErrorHandler *this_00;
  type rejects_00;
  ulong uVar6;
  shared_ptr<duckdb::CSVRejectsTable,_true> rejects;
  _Alloc_hider local_198;
  InternalAppender scans_appender;
  InternalAppender errors_appender;
  
  pTVar1 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&this->bind_data->bind_data);
  if (*(char *)((long)&pTVar1[5].column_ids.
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 3) == '\x01') {
    limit = pTVar1[8].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
    CSVRejectsTable::GetOrCreate
              ((CSVRejectsTable *)&rejects,this->context,(string *)&pTVar1[7].column_ids,
               (string *)(pTVar1 + 6));
    pCVar2 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    ::std::mutex::lock(&pCVar2->write_lock);
    pCVar3 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    table_p = CSVRejectsTable::GetErrorsTable(pCVar3,this->context);
    pCVar3 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    table_p_00 = CSVRejectsTable::GetScansTable(pCVar3,this->context);
    InternalAppender::InternalAppender(&errors_appender,this->context,table_p,0x32000);
    InternalAppender::InternalAppender(&scans_appender,this->context,table_p_00,0x32000);
    scan_idx = TransactionContext::GetActiveQuery(&this->context->transaction);
    iVar4 = optional_idx::GetIndex(&(scan->super_BaseFileReader).file_list_idx);
    for (uVar6 = (long)(this->rejects_file_indexes).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->rejects_file_indexes).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3; uVar6 <= iVar4; uVar6 = uVar6 + 1) {
      pCVar3 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
      local_198._M_p = (pointer)CSVRejectsTable::GetCurrentFileIndex(pCVar3,scan_idx);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &this->rejects_file_indexes,(unsigned_long *)&local_198);
    }
    pvVar5 = vector<unsigned_long,_true>::get<true>(&this->rejects_file_indexes,iVar4);
    iVar4 = *pvVar5;
    this_00 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(&scan->error_handler);
    rejects_00 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator*(&rejects);
    CSVErrorHandler::FillRejectsTable
              (this_00,&errors_appender,iVar4,scan_idx,scan,rejects_00,this->bind_data,(idx_t)limit)
    ;
    pCVar3 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
    if (pCVar3->count != 0) {
      pCVar3 = shared_ptr<duckdb::CSVRejectsTable,_true>::operator->(&rejects);
      pCVar3->count = 0;
      FillScanErrorTable(&scans_appender,scan_idx,iVar4,scan);
    }
    BaseAppender::Close(&errors_appender.super_BaseAppender);
    BaseAppender::Close(&scans_appender.super_BaseAppender);
    InternalAppender::~InternalAppender(&scans_appender);
    InternalAppender::~InternalAppender(&errors_appender);
    pthread_mutex_unlock((pthread_mutex_t *)&pCVar2->write_lock);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rejects.internal.
                super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  return;
}

Assistant:

void CSVGlobalState::FillRejectsTable(CSVFileScan &scan) {
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	auto &options = csv_data.options;

	if (!options.store_rejects.GetValue()) {
		return;
	}
	auto limit = options.rejects_limit;
	auto rejects = CSVRejectsTable::GetOrCreate(context, options.rejects_scan_name.GetValue(),
	                                            options.rejects_table_name.GetValue());
	lock_guard<mutex> lock(rejects->write_lock);
	auto &errors_table = rejects->GetErrorsTable(context);
	auto &scans_table = rejects->GetScansTable(context);
	InternalAppender errors_appender(context, errors_table);
	InternalAppender scans_appender(context, scans_table);
	idx_t scan_idx = context.transaction.GetActiveQuery();

	// get the file indexes for the rejects table
	// we store these so that they are deterministic (i.e. file index 0 always gets the lowest rejects index)
	// otherwise parallelism can result in out-of-order file indexes
	auto file_idx = scan.GetFileIndex();
	for (idx_t i = rejects_file_indexes.size(); i <= file_idx; i++) {
		rejects_file_indexes.push_back(rejects->GetCurrentFileIndex(scan_idx));
	}
	const idx_t rejects_file_idx = rejects_file_indexes[file_idx];
	scan.error_handler->FillRejectsTable(errors_appender, rejects_file_idx, scan_idx, scan, *rejects, bind_data, limit);
	if (rejects->count != 0) {
		rejects->count = 0;
		FillScanErrorTable(scans_appender, scan_idx, rejects_file_idx, scan);
	}
	errors_appender.Close();
	scans_appender.Close();
}